

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

void __thiscall
google::
sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
::swap(sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
       *this,sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
             *ht)

{
  long in_RSI;
  sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  *in_RDI;
  KeyInfo *in_stack_00000008;
  KeyInfo *in_stack_00000010;
  sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
  *in_stack_ffffffffffffffd8;
  
  std::
  swap<google::sparse_hashtable<std::pair<std::__cxx11::string_const,DenseStringSet>,std::__cxx11::string,Hasher,google::sparse_hash_map<std::__cxx11::string,DenseStringSet,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,DenseStringSet>>>::SelectKey,google::sparse_hash_map<std::__cxx11::string,DenseStringSet,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,DenseStringSet>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,DenseStringSet>>>::Settings>
            ((Settings *)in_stack_00000010,(Settings *)in_stack_00000008);
  std::
  swap<google::sparse_hashtable<std::pair<std::__cxx11::string_const,DenseStringSet>,std::__cxx11::string,Hasher,google::sparse_hash_map<std::__cxx11::string,DenseStringSet,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,DenseStringSet>>>::SelectKey,google::sparse_hash_map<std::__cxx11::string,DenseStringSet,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,DenseStringSet>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,DenseStringSet>>>::KeyInfo>
            (in_stack_00000010,in_stack_00000008);
  std::swap<unsigned_long>((unsigned_long *)(in_RDI + 2),(unsigned_long *)(in_RSI + 0x60));
  sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
  ::swap((sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
          *)in_RDI,in_stack_ffffffffffffffd8);
  bucket_count((sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
                *)0x10418e1);
  sparsehash_internal::
  sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  ::reset_thresholds(in_RDI,(size_type)in_stack_ffffffffffffffd8);
  bucket_count((sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
                *)0x1041902);
  sparsehash_internal::
  sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  ::reset_thresholds(in_RDI,(size_type)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void swap(sparse_hashtable& ht) {
    std::swap(settings, ht.settings);
    std::swap(key_info, ht.key_info);
    std::swap(num_deleted, ht.num_deleted);
    table.swap(ht.table);
    settings.reset_thresholds(bucket_count());  // also resets consider_shrink
    ht.settings.reset_thresholds(ht.bucket_count());
    // we purposefully don't swap the allocator, which may not be swap-able
  }